

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

char * ndiCommandVA(ndicapi *api,char *format,__va_list_tag *ap)

{
  byte *__s;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  _func_void_int_char_ptr_void_ptr *p_Var6;
  unsigned_long uVar7;
  byte bVar8;
  char cVar9;
  void *pvVar10;
  ulong uVar11;
  char *commandReply;
  char *commandReply_00;
  size_t __n;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  NDIMutex mutex;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  int errorCode;
  int errorCode_1;
  bool local_4e;
  uint local_4c;
  char *local_48;
  size_t local_40;
  int local_34;
  
  local_4c = 0;
  __s = (byte *)api->Command;
  pcVar12 = api->Reply;
  pcVar13 = api->ReplyNoCRC;
  api->ErrorCode = 0;
  *__s = 0;
  *pcVar12 = '\0';
  *pcVar13 = '\0';
  local_48 = pcVar13;
  if (((api->SerialDevice == -1) && (api->Hostname == (char *)0x0)) && (api->Port < 0)) {
    api->ErrorCode = 0x101;
    p_Var6 = api->ErrorCallback;
    if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return pcVar13;
    }
    pvVar10 = api->ErrorCallbackData;
    pcVar12 = "Error opening serial connection";
    iVar5 = 0x101;
    goto LAB_00107885;
  }
  if (format == (char *)0x0) {
    if ((api->IsThreadedMode == true) && (api->IsTracking == true)) {
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;
    if (api->SerialDevice == -1) {
      iVar5 = ndiSocketRead(api->Socket,pcVar12,0x7ff,false,&local_34);
    }
    else {
      ndiSerialComm(api->SerialDevice,0x2580,"8N1",0);
      ndiSerialFlush(api->SerialDevice,3);
      ndiSerialBreak(api->SerialDevice);
      iVar5 = ndiSerialRead(api->SerialDevice,pcVar12,0x7ff,false,(int *)&local_4c);
    }
    iVar18 = strncmp(pcVar12,"RESETBE6F\r",8);
    if (iVar18 == 0) {
      lVar14 = (long)iVar5;
      pcVar12[lVar14] = '\0';
      strncpy(pcVar13,pcVar12,lVar14 - 5);
      pcVar13[lVar14 + -5] = '\0';
      return local_48;
    }
    api->ErrorCode = 0x106;
    p_Var6 = api->ErrorCallback;
    if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return local_48;
    }
    pvVar10 = api->ErrorCallbackData;
    pcVar12 = "Measurement System failed to reset on break";
    iVar5 = 0x106;
    goto LAB_00107885;
  }
  vsprintf((char *)__s,format,ap);
  bVar8 = *__s;
  if (bVar8 == 0) {
    lVar14 = 0;
    iVar5 = 0;
    bVar3 = false;
    uVar11 = 0;
    iVar18 = 0;
  }
  else {
    bVar1 = true;
    lVar14 = 0;
    uVar17 = 0;
    iVar5 = 0;
    bVar2 = false;
    do {
      bVar15 = (byte)(uVar17 & 0xffff) ^ bVar8;
      uVar17 = (uVar17 & 0xffff) >> 8;
      if (oddparity[bVar15 & 0xf] != oddparity[bVar15 >> 4]) {
        uVar17 = uVar17 ^ 0xffffc001;
      }
      uVar17 = (uint)bVar15 << 7 ^ (uint)bVar15 << 6 ^ uVar17;
      bVar3 = bVar2;
      if (bVar1) {
        bVar3 = true;
      }
      if (bVar8 != 0x3a) {
        bVar3 = bVar2;
      }
      bVar19 = (byte)(bVar8 - 0x30) < 10;
      bVar2 = false;
      if (bVar19) {
        bVar2 = bVar1;
      }
      iVar18 = (int)lVar14;
      if (bVar19) {
        iVar18 = iVar5;
      }
      if ((bool)(bVar1 & (byte)(bVar8 + 0xa5) < 0xe6)) {
        iVar5 = iVar18;
        bVar1 = bVar2;
      }
      bVar8 = __s[lVar14 + 1];
      lVar14 = lVar14 + 1;
      bVar2 = bVar3;
    } while (bVar8 != 0);
    iVar18 = (int)lVar14;
    if (bVar1) {
      iVar5 = iVar18;
    }
    uVar11 = (ulong)(uVar17 & 0xffff);
  }
  if (bVar3) {
    sprintf((char *)(__s + lVar14),"%04X",uVar11);
    iVar18 = iVar18 + 4;
  }
  (__s + iVar18)[0] = 0xd;
  (__s + iVar18)[1] = 0;
  __n = (size_t)iVar5;
  iVar4 = strncmp((char *)__s,"BX",__n);
  local_4e = true;
  if ((iVar5 != 2 || iVar4 != 0) &&
     (iVar4 = strncmp((char *)__s,"GETLOG",__n), iVar5 != 6 || iVar4 != 0)) {
    iVar4 = strncmp((char *)__s,"VGET",__n);
    local_4e = iVar5 == 4 && iVar4 == 0;
  }
  bVar3 = api->IsThreadedMode;
  local_40 = __n;
  if (bVar3 == true) {
    if ((api->IsTracking != true) || (iVar5 != 2)) {
code_r0x00107536:
      if (api->IsTracking == true) {
        ndiMutexLock(api->ThreadMutex);
      }
      goto LAB_00107546;
    }
    bVar8 = *__s;
    if (bVar8 == 0x42) {
      bVar8 = __s[1];
    }
    else if (bVar8 == 0x54) {
      bVar8 = __s[1];
    }
    else {
      if (bVar8 != 0x47) goto code_r0x00107536;
      bVar8 = __s[1];
    }
    if (bVar8 != 0x58) goto code_r0x00107536;
    iVar18 = strcmp((char *)__s,api->ThreadCommand);
    if (iVar18 != 0) {
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand,(char *)__s);
      api->IsThreadedCommandBinary = *__s == 0x42;
      ndiMutexUnlock(api->ThreadMutex);
      iVar18 = ndiEventWait(api->ThreadBufferEvent,5000);
      if (iVar18 == 0) goto LAB_001074e6;
LAB_001074fc:
      api->ErrorCode = 0x103;
      p_Var6 = api->ErrorCallback;
      if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
        return local_48;
      }
      pvVar10 = api->ErrorCallbackData;
      pcVar12 = "Device->host communication timeout";
      iVar5 = 0x103;
      goto LAB_00107885;
    }
LAB_001074e6:
    iVar18 = ndiEventWait(api->ThreadBufferEvent,5000);
    if (iVar18 != 0) goto LAB_001074fc;
    ndiMutexLock(api->ThreadBufferMutex);
    cVar9 = *api->ThreadBuffer;
    if (cVar9 == '\0') {
      iVar18 = 0;
      lVar14 = 0;
    }
    else {
      lVar14 = 0;
      do {
        pcVar12[lVar14] = cVar9;
        cVar9 = api->ThreadBuffer[lVar14 + 1];
        lVar14 = lVar14 + 1;
      } while (cVar9 != '\0');
      iVar18 = (int)lVar14;
    }
    if (local_4e == false) {
      pcVar12[lVar14] = '\0';
    }
    local_4c = api->ThreadErrorCode;
    mutex = api->ThreadBufferMutex;
LAB_0010773d:
    ndiMutexUnlock(mutex);
  }
  else {
LAB_00107546:
    if (iVar5 == 4) {
      iVar4 = strncmp((char *)__s,"INIT",__n);
joined_r0x00107595:
      if (iVar4 == 0) {
        api->IsTracking = false;
      }
    }
    else if (iVar5 == 6) {
      iVar4 = strncmp((char *)__s,"TSTART",__n);
      if ((iVar4 == 0) && (api->IsTracking = true, bVar3 != false)) {
        *api->ThreadCommand = '\0';
      }
    }
    else if (iVar5 == 5) {
      iVar4 = strncmp((char *)__s,"TSTOP",__n);
      goto joined_r0x00107595;
    }
    if (api->SerialDevice == -1) {
      ndiSocketFlush(api->Socket,1);
    }
    else {
      ndiSerialFlush(api->SerialDevice,1);
    }
    if (api->SerialDevice == -1) {
      iVar4 = ndiSocketWrite(api->Socket,(char *)__s,iVar18 + 1);
    }
    else {
      iVar4 = ndiSerialWrite(api->SerialDevice,(char *)__s,iVar18 + 1);
    }
    if (iVar4 < 0) {
      local_4c = 0x104;
    }
    else if (iVar4 <= iVar18) {
      local_4c = 0x103;
    }
    iVar18 = 0;
    if (local_4c == 0) {
      if (api->SerialDevice == -1) {
        uVar17 = ndiSocketRead(api->Socket,pcVar12,0x7ff,local_4e,(int *)&local_4c);
      }
      else {
        uVar17 = ndiSerialRead(api->SerialDevice,pcVar12,0x7ff,local_4e,(int *)&local_4c);
      }
      uVar11 = (ulong)uVar17;
      if ((int)uVar17 < 0) {
        local_4c = 0x105;
LAB_0010771f:
        uVar11 = 0;
      }
      else if (uVar17 == 0) {
        local_4c = 0x103;
        goto LAB_0010771f;
      }
      iVar18 = (int)uVar11;
      if (local_4e == false) {
        pcVar12[uVar11] = '\0';
      }
    }
    if ((api->IsTracking & bVar3) != 0) {
      mutex = api->ThreadMutex;
      goto LAB_0010773d;
    }
  }
  uVar17 = local_4c;
  if (local_4c != 0) {
    api->ErrorCode = local_4c;
    p_Var6 = api->ErrorCallback;
    if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
      return local_48;
    }
    pcVar12 = ndiErrorString(local_4c);
    pvVar10 = api->ErrorCallbackData;
    goto LAB_00107775;
  }
  uVar17 = ((uint)local_4e + (uint)local_4e * 2 + iVar18) - 5;
  if (-1 < (int)uVar17) {
    if (uVar17 == 0) {
      uVar16 = 0;
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      uVar16 = 0;
      do {
        bVar8 = (byte)(uVar16 & 0xffff) ^ pcVar12[uVar11];
        uVar16 = (uVar16 & 0xffff) >> 8;
        if (oddparity[bVar8 & 0xf] != oddparity[bVar8 >> 4]) {
          uVar16 = uVar16 ^ 0xffffc001;
        }
        uVar16 = (uint)bVar8 << 7 ^ (uint)bVar8 << 6 ^ uVar16;
        local_48[uVar11] = pcVar12[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
    }
    if (local_4e == false) {
      local_48[uVar11] = '\0';
      uVar7 = ndiHexToUnsignedLong(pcVar12 + uVar17,4);
      if (uVar7 == (uVar16 & 0xffff)) goto LAB_001078b6;
    }
    else if ((uint)*(ushort *)(pcVar12 + uVar17) == (uVar16 & 0xffff)) {
LAB_001078b6:
      pcVar12 = local_48;
      if ((*local_48 != 'E') || (iVar18 = strncmp(local_48,"ERROR",5), iVar18 != 0)) {
        bVar8 = *__s;
        if (bVar8 == 0x42) {
          if ((__s[1] == 0x58) && (iVar5 == 2)) {
            anon_unknown.dwarf_ae8::ndiBXHelper(api,(char *)__s,pcVar12);
            return local_48;
          }
        }
        else if (bVar8 == 0x47) {
          if ((__s[1] == 0x58) && (iVar5 == 2)) {
            anon_unknown.dwarf_ae8::ndiGXHelper(api,(char *)__s,pcVar12);
            return local_48;
          }
        }
        else if (((bVar8 == 0x54) && (__s[1] == 0x58)) && (iVar5 == 2)) {
          anon_unknown.dwarf_ae8::ndiTXHelper(api,(char *)__s,pcVar12);
          return local_48;
        }
        if (((bVar8 == 0x43) && (iVar5 == 4)) &&
           (iVar18 = strncmp((char *)__s,"COMM",local_40), iVar18 == 0)) {
          anon_unknown.dwarf_ae8::ndiCOMMHelper(api,(char *)__s,commandReply);
          return local_48;
        }
        if ((bVar8 == 0x49) && (iVar5 == 4)) {
          pcVar13 = "INIT";
          iVar18 = strncmp((char *)__s,"INIT",local_40);
          if (iVar18 == 0) {
            anon_unknown.dwarf_ae8::ndiINITHelper(api,pcVar13,commandReply_00);
            return local_48;
          }
        }
        if (((bVar8 == 0x49) && (iVar5 == 5)) &&
           (iVar18 = strncmp((char *)__s,"IRCHK",local_40), iVar18 == 0)) {
          anon_unknown.dwarf_ae8::ndiIRCHKHelper(api,(char *)__s,pcVar12);
          return local_48;
        }
        bVar15 = bVar8 ^ 0x50;
        if ((iVar5 == 5 && bVar15 == 0) &&
           (iVar18 = strncmp((char *)__s,"PHINF",local_40), iVar18 == 0)) {
          anon_unknown.dwarf_ae8::ndiPHINFHelper(api,(char *)__s,local_48);
          return local_48;
        }
        if (bVar15 == 0 && iVar5 == 4) {
          iVar18 = strncmp((char *)__s,"PHRQ",local_40);
          if (iVar18 == 0) {
            lVar14 = 0;
            do {
              api->PhrqReply[lVar14] = local_48[lVar14];
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 == 1);
            return local_48;
          }
          if ((bVar15 == 0 && iVar5 == 4) &&
             (iVar18 = strncmp((char *)__s,"PHSR",local_40), iVar18 == 0)) {
            lVar14 = 0;
            do {
              if (local_48[lVar14] < ' ') break;
              api->PhsrReply[lVar14] = local_48[lVar14];
              lVar14 = lVar14 + 1;
            } while ((int)lVar14 != 0x502);
            api->PhsrReply[lVar14] = '\0';
            return local_48;
          }
        }
        if ((iVar5 == 5 && bVar15 == 0) &&
           (iVar18 = strncmp((char *)__s,"PSTAT",local_40), iVar18 == 0)) {
          anon_unknown.dwarf_ae8::ndiPSTATHelper(api,(char *)__s,local_48);
          return local_48;
        }
        if (bVar8 != 0x53) {
          return local_48;
        }
        if (iVar5 != 5) {
          return local_48;
        }
        iVar5 = strncmp((char *)__s,"SSTAT",local_40);
        if (iVar5 != 0) {
          return local_48;
        }
        anon_unknown.dwarf_ae8::ndiSSTATHelper(api,(char *)__s,local_48);
        return local_48;
      }
      uVar7 = ndiHexToUnsignedLong(pcVar12 + 5,2);
      uVar17 = (uint)uVar7;
      api->ErrorCode = uVar17;
      p_Var6 = api->ErrorCallback;
      if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
        return local_48;
      }
      pcVar12 = ndiErrorString(uVar17);
      pvVar10 = api->ErrorCallbackData;
LAB_00107775:
      (*p_Var6)(uVar17,pcVar12,pvVar10);
      return local_48;
    }
  }
  api->ErrorCode = 0x100;
  p_Var6 = api->ErrorCallback;
  if (p_Var6 == (_func_void_int_char_ptr_void_ptr *)0x0) {
    return local_48;
  }
  pvVar10 = api->ErrorCallbackData;
  pcVar12 = "Bad CRC on reply from Measurement System";
  iVar5 = 0x100;
LAB_00107885:
  (*p_Var6)(iVar5,pcVar12,pvVar10);
  return local_48;
}

Assistant:

ndicapiExport char* ndiCommandVA(ndicapi* api, const char* format, va_list ap)
{
  int i, bytes, commandLength;
  bool useCrc = false;
  bool inCommand = true;
  char* command;
  char* reply;
  char* commandReply;
  int errorCode = 0;

  command = api->Command;       // text sent to ndicapi
  reply = api->Reply;     // text received from ndicapi
  commandReply = api->ReplyNoCRC;   // received text, with CRC hacked off
  commandLength = 0;                  // length of 'command' part of command

  api->ErrorCode = 0;                 // clear error
  command[0] = '\0';
  reply[0] = '\0';
  commandReply[0] = '\0';

  // verify that the serial device was opened
  if (api->SerialDevice == NDI_INVALID_HANDLE && api->Hostname == NULL && api->Port < 0)
  {
    ndiSetError(api, NDI_OPEN_ERROR);
    return commandReply;
  }

  // if the command is NULL, send a break to reset the Measurement System
  if (format == NULL)
  {
    if (api->IsThreadedMode && api->IsTracking)
    {
      // block the tracking thread
      ndiMutexLock(api->ThreadMutex);
    }
    api->IsTracking = false;

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      ndiSerialComm(api->SerialDevice, 9600, "8N1", 0);
      ndiSerialFlush(api->SerialDevice, NDI_IOFLUSH);
      ndiSerialBreak(api->SerialDevice);
      bytes = ndiSerialRead(api->SerialDevice, reply, 2047, false, &errorCode);
    }
    else
    {
      int errorCode;
      bytes = ndiSocketRead(api->Socket, reply, 2047, false, &errorCode);
    }

    // check for correct reply
    if (strncmp(reply, "RESETBE6F\r", 8) != 0)
    {
      ndiSetError(api, NDI_RESET_FAIL);
      return commandReply;
    }

    // terminate the reply string
    reply[bytes] = '\0';
    bytes -= 5;
    strncpy(commandReply, reply, bytes);
    commandReply[bytes] = '\0';

    // return the reply string, minus the CRC
    return commandReply;
  }

  vsprintf(command, format, ap);                    // format parameters

  unsigned short CRC16 = 0;                         // calculate CRC
  for (i = 0; command[i] != '\0'; i++)
  {
    CalcCRC16(command[i], &CRC16);
    if (inCommand && command[i] == ':')             // only use CRC if a ':'
    {
      useCrc = true;                                //  follows the command
    }
    if (inCommand && !((command[i] >= 'A' && command[i] <= 'Z') ||
                       (command[i] >= '0' && command[i] <= '9')))
    {
      inCommand = false;                            // 'command' part has ended
      commandLength = i;                            // command length
    }
  }
  if (inCommand)
  {
    // Command was sent with no ':'
    // Example, ndiCommand("INIT");
    commandLength = i;
  }

  if (useCrc)
  {
    sprintf(&command[i], "%04X", CRC16);            // tack on the CRC
    i += 4;
  }

  command[i++] = '\r';                              // tack on carriage return
  command[i] = '\0';                                // terminate for good luck

  bool isBinary = (strncmp(command, "BX", commandLength) == 0 && commandLength == strlen("BX") ||
                   strncmp(command, "GETLOG", commandLength) == 0 && commandLength == strlen("GETLOG") ||
                   strncmp(command, "VGET", commandLength) == 0 && commandLength == strlen("VGET"));


  // if the command is GX, TX, or BX and thread_mode is on, we copy the reply from
  //  the thread rather than getting it directly from the Measurement System
  if (api->IsThreadedMode && api->IsTracking &&
      commandLength == 2 && (command[0] == 'G' && command[1] == 'X' ||
                             command[0] == 'T' && command[1] == 'X' ||
                             command[0] == 'B' && command[1] == 'X'))
  {
    // check that the thread is sending the GX/BX/TX command that we want
    if (strcmp(command, api->ThreadCommand) != 0)
    {
      // tell thread to start using the new GX/BX/TX command
      ndiMutexLock(api->ThreadMutex);
      strcpy(api->ThreadCommand, command);
      api->IsThreadedCommandBinary = (command[0] == 'B');
      ndiMutexUnlock(api->ThreadMutex);
      // wait for the next data record to arrive (we have to throw it away)
      if (ndiEventWait(api->ThreadBufferEvent, 5000))
      {
        ndiSetError(api, NDI_TIMEOUT);
        return commandReply;
      }
    }
    // there is usually no wait, because usually new data is ready
    if (ndiEventWait(api->ThreadBufferEvent, 5000))
    {
      ndiSetError(api, NDI_TIMEOUT);
      return commandReply;
    }
    // copy the thread's reply buffer into the main reply buffer
    ndiMutexLock(api->ThreadBufferMutex);
    for (bytes = 0; api->ThreadBuffer[bytes] != '\0'; bytes++)
    {
      reply[bytes] = api->ThreadBuffer[bytes];
    }
    if (!isBinary)
    {
      reply[bytes] = '\0';   // terminate string
    }
    errorCode = api->ThreadErrorCode;
    ndiMutexUnlock(api->ThreadBufferMutex);

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }
  // if the command is not a GX or thread_mode is not on, then
  //   send the command directly to the Measurement System and get a reply
  else
  {
    bool isThreadMode = api->IsThreadedMode;

    if (isThreadMode && api->IsTracking)
    {
      // block the tracking thread while we slip this command through
      ndiMutexLock(api->ThreadMutex);
    }

    // change pol->tracking if either TSTOP or TSTART is sent
    if ((commandLength == 5 && strncmp(command, "TSTOP", commandLength) == 0) ||
        (commandLength == 4 && strncmp(command, "INIT", commandLength) == 0))
    {
      api->IsTracking = false;
    }
    else if (commandLength == 6 && strncmp(command, "TSTART", commandLength) == 0)
    {
      api->IsTracking = true;
      if (isThreadMode)
      {
        // this will force the thread to wait until the application sends the first GX command
        api->ThreadCommand[0] = '\0';
      }
    }

    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      // flush the input buffer, because anything that we haven't read
      //   yet is garbage left over by a previously failed command
      ndiSerialFlush(api->SerialDevice, NDI_IFLUSH);
    }
    else
    {
      ndiSocketFlush(api->Socket, NDI_IFLUSH);
    }

    // send the command to the Measurement System
    if (api->SerialDevice != NDI_INVALID_HANDLE)
    {
      bytes = ndiSerialWrite(api->SerialDevice, command, i);
    }
    else
    {
      bytes = ndiSocketWrite(api->Socket, command, i);
    }
    if (bytes < 0)
    {
      errorCode = NDI_WRITE_ERROR;
    }
    else if (bytes < i)
    {
      errorCode = NDI_TIMEOUT;
    }

    // read the reply from the Measurement System
    bytes = 0;
    if (errorCode == 0)
    {
      if (api->SerialDevice != NDI_INVALID_HANDLE)
      {
        bytes = ndiSerialRead(api->SerialDevice, reply, 2047, isBinary, &errorCode);
      }
      else
      {
        bytes = ndiSocketRead(api->Socket, reply, 2047, isBinary, &errorCode);
      }
      if (bytes < 0)
      {
        errorCode = NDI_READ_ERROR;
        bytes = 0;
      }
      else if (bytes == 0)
      {
        errorCode = NDI_TIMEOUT;
      }
      if (!isBinary)
      {
        reply[bytes] = '\0';   // terminate string
      }
    }

    if (isThreadMode & api->IsTracking)
    {
      // unblock the tracking thread
      ndiMutexUnlock(api->ThreadMutex);
    }

    if (errorCode != 0)
    {
      ndiSetError(api, errorCode);
      return commandReply;
    }
  }

  // back up to before the CRC
  if (!isBinary)
  {
    bytes -= 5; // 4 ASCII chars
  }
  else
  {
    bytes -= 2; // 2 bytes (unsigned short)
  }
  if (bytes < 0)
  {
    ndiSetError(api, NDI_BAD_CRC);
    return commandReply;
  }

  // calculate the CRC and copy serial_reply to command_reply
  CRC16 = 0;
  for (i = 0; i < bytes; i++)
  {
    CalcCRC16(reply[i], &CRC16);
    commandReply[i] = reply[i];
  }

  if (!isBinary)
  {
    // terminate command_reply before the CRC
    commandReply[i] = '\0';
  }

  if (errorCode != 0)
  {
    // Any above errors are caught here and returned after the command has had its CRC stripped
    return commandReply;
  }

  if (!isBinary)
  {
    // read and check the CRC value of the reply
    if (CRC16 != ndiHexToUnsignedLong(&reply[bytes], 4))
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }
  else
  {
    unsigned short replyCrc = (unsigned char)reply[bytes + 1] << 8 | (unsigned char)reply[bytes];
    if (replyCrc != CRC16)
    {
      ndiSetError(api, NDI_BAD_CRC);
      return commandReply;
    }
  }

  // check for error code
  if (commandReply[0] == 'E' && strncmp(commandReply, "ERROR", 5) == 0)
  {
    ndiSetError(api, ndiHexToUnsignedLong(&commandReply[5], 2));
    return commandReply;
  }

  // special behavior for specific commands
  if (command[0] == 'T' && command[1] == 'X' && commandLength == 2)   // the TX command
  {
    ndiTXHelper(api, command, commandReply);
  }
  else if (command[0] == 'B' && command[1] == 'X' && commandLength == 2)   // the BX command
  {
    ndiBXHelper(api, command, commandReply);
  }
  else if (command[0] == 'G' && command[1] == 'X' && commandLength == 2)   // the GX command
  {
    ndiGXHelper(api, command, commandReply);
  }
  else if (command[0] == 'C' && commandLength == 4 && strncmp(command, "COMM", commandLength) == 0)
  {
    ndiCOMMHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 4 && strncmp(command, "INIT", commandLength) == 0)
  {
    ndiINITHelper(api, command, commandReply);
  }
  else if (command[0] == 'I' && commandLength == 5 && strncmp(command, "IRCHK", commandLength) == 0)
  {
    ndiIRCHKHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PHINF", commandLength) == 0)
  {
    ndiPHINFHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHRQ", commandLength) == 0)
  {
    ndiPHRQHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 4 && strncmp(command, "PHSR", commandLength) == 0)
  {
    ndiPHSRHelper(api, command, commandReply);
  }
  else if (command[0] == 'P' && commandLength == 5 && strncmp(command, "PSTAT", commandLength) == 0)
  {
    ndiPSTATHelper(api, command, commandReply);
  }
  else if (command[0] == 'S' && commandLength == 5 && strncmp(command, "SSTAT", commandLength) == 0)
  {
    ndiSSTATHelper(api, command, commandReply);
  }

  // return the Measurement System reply, but with the CRC hacked off
  return commandReply;
}